

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_ieee754_round(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_198;
  operation local_194;
  operand local_190 [2];
  operation local_188 [2];
  operand local_180 [2];
  operation local_178 [2];
  operand local_170;
  operation local_16c [2];
  operand local_164 [2];
  operation local_15c;
  operand local_158 [2];
  operation local_150 [2];
  operand local_148 [2];
  operation local_140;
  operand local_13c [2];
  operation local_134;
  uint64_t local_130;
  uint64_t header;
  operation local_120;
  operand local_11c;
  operation local_118;
  operand local_114;
  operation local_110 [2];
  operand local_108 [2];
  operation local_100 [4];
  operand local_f0;
  operation local_ec;
  unsigned_long local_e8;
  operand local_dc [2];
  operation local_d4 [3];
  operand local_c8 [2];
  operation local_c0 [3];
  operand local_b4 [2];
  operation local_ac;
  string local_a8;
  undefined1 local_88 [8];
  string save_flonum;
  undefined1 local_58 [8];
  string is_fixnum;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(is_fixnum.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_88,psVar1,lab_00);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a8,psVar1,lab_01);
    std::__cxx11::string::operator=
              ((string *)(is_fixnum.field_2._M_local_buf + 8),(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_ac = CMP;
    local_b4[1] = 0x14;
    local_b4[0] = NUMBER;
    local_c0[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ac,local_b4 + 1,local_b4,(int *)(local_c0 + 2));
    local_c0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_c0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&is_fixnum.field_2 + 8));
  }
  local_c0[0] = TEST;
  local_c8[1] = 0xb;
  local_c8[0] = NUMBER;
  local_d4[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_c0,local_c8 + 1,local_c8,(int *)(local_d4 + 2));
  local_d4[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_d4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)((long)&is_fixnum.field_2 + 8));
  }
  local_d4[0] = AND;
  local_dc[1] = 0xb;
  local_dc[0] = NUMBER;
  local_e8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_d4,local_dc + 1,local_dc,&local_e8);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_short_if_arg_does_not_point_to_flonum
              (code,RCX,R11,(string *)((long)&is_fixnum.field_2 + 8));
  }
  local_ec = FLD;
  local_f0 = MEM_RCX;
  local_100[3] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,&local_ec,&local_f0,(int *)(local_100 + 3));
  local_100[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_100 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_100[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_100 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_100[0] = SAR;
  local_108[1] = 0xb;
  local_108[0] = NUMBER;
  local_110[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_100,local_108 + 1,local_108,(int *)(local_110 + 1));
  local_110[0] = PUSH;
  local_114 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_110,&local_114);
  local_118 = FILD;
  local_11c = MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_118,&local_11c);
  local_120 = POP;
  header._4_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_120,(operand *)((long)&header + 4));
  header._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&header,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  local_130 = make_block_header(1,T_FLONUM);
  local_134 = MOV;
  local_13c[1] = 0x14;
  local_13c[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_134,local_13c + 1,local_13c);
  local_140 = OR;
  local_148[1] = 0x14;
  local_148[0] = NUMBER;
  local_150[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_140,local_148 + 1,local_148,(int *)(local_150 + 1));
  local_150[0] = MOV;
  local_158[1] = 9;
  local_158[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_150,local_158 + 1,local_158,&local_130);
  local_15c = MOV;
  local_164[1] = 0x20;
  local_164[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_15c,local_164 + 1,local_164);
  local_16c[1] = 0x1f;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_16c + 1);
  local_16c[0] = FSTP;
  local_170 = MEM_RBP;
  local_178[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,local_16c,&local_170,(int *)(local_178 + 1));
  local_178[0] = ADD;
  local_180[1] = 0x10;
  local_180[0] = NUMBER;
  local_188[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_178,local_180 + 1,local_180,(int *)(local_188 + 1));
  local_188[0] = MOV;
  local_190[1] = 9;
  local_190[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_188,local_190 + 1,local_190);
  local_194 = JMP;
  local_198 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_194,&local_198);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&is_fixnum.field_2 + 8),re_ieee754_round_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(is_fixnum.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_ieee754_round(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string is_fixnum = label_to_string(label++);
  std::string save_flonum = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, is_fixnum);
  if (ops.safe_primitives)
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);

  code.add(asmcode::FLD, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::JMPS, save_flonum);
  code.add(asmcode::LABEL, is_fixnum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::FILD, asmcode::MEM_RSP);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::LABEL, save_flonum);

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(asmcode::MOV, asmcode::R11, ALLOC);
  code.add(asmcode::OR, asmcode::R11, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::FRNDINT);
  code.add(asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_ieee754_round_contract_violation);
    }
  }